

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

file_conflict * file_new(archive_write *a,archive_entry *entry)

{
  long lVar1;
  mode_t mVar2;
  archive_entry *paVar3;
  file_conflict *file;
  archive_entry *entry_local;
  archive_write *a_local;
  
  a_local = (archive_write *)calloc(1,0x170);
  if (a_local == (archive_write *)0x0) {
    a_local = (archive_write *)0x0;
  }
  else {
    if (entry == (archive_entry *)0x0) {
      paVar3 = archive_entry_new2((archive_conflict *)a);
      *(archive_entry **)&(a_local->archive).file_count = paVar3;
    }
    else {
      paVar3 = archive_entry_clone(entry);
      *(archive_entry **)&(a_local->archive).file_count = paVar3;
    }
    lVar1._0_4_ = (a_local->archive).file_count;
    lVar1._4_4_ = (a_local->archive).archive_error_number;
    if (lVar1 == 0) {
      free(a_local);
      a_local = (archive_write *)0x0;
    }
    else {
      __archive_rb_tree_init((archive_rb_tree *)&(a_local->archive).error,&file_new::rb_ops);
      (a_local->archive).read_data_block = (char *)0x0;
      (a_local->archive).read_data_offset = (int64_t)&(a_local->archive).read_data_block;
      a_local->client_writer = (archive_write_callback *)0x0;
      a_local->client_closer = (undefined1 *)&a_local->client_writer;
      (a_local->archive).read_data_output_offset = 0;
      (a_local->archive).read_data_remaining = 0;
      *(undefined8 *)&(a_local->archive).read_data_is_posix_read = 0;
      (a_local->archive).read_data_requested = 0;
      *(undefined8 *)&a_local->skip_file_set = 0;
      a_local->skip_file_dev = 0;
      a_local->skip_file_ino = 0;
      a_local->nulls = (uchar *)0x0;
      a_local->null_length = 0;
      a_local->passphrase_client_data = (void *)0x0;
      a_local[1].archive.magic = 0;
      a_local[1].archive.state = 0;
      a_local[1].archive.vtable = (archive_vtable *)0x0;
      if ((entry != (archive_entry *)0x0) &&
         (mVar2 = archive_entry_filetype(entry), mVar2 == 0x4000)) {
        *(byte *)&a_local[1].archive.archive_format =
             (byte)a_local[1].archive.archive_format & 0xfd | 2;
      }
    }
  }
  return (file_conflict *)a_local;
}

Assistant:

static int
file_new(struct archive_read *a, struct xar *xar, struct xmlattr_list *list)
{
	struct xar_file *file;
	struct xmlattr *attr;

	file = calloc(1, sizeof(*file));
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	file->parent = xar->file;
	file->mode = 0777 | AE_IFREG;
	file->atime =  0;
	file->mtime = 0;
	xar->file = file;
	xar->xattr = NULL;
	for (attr = list->first; attr != NULL; attr = attr->next) {
		if (strcmp(attr->name, "id") == 0)
			file->id = atol10(attr->value, strlen(attr->value));
	}
	file->nlink = 1;
	if (heap_add_entry(a, &(xar->file_queue), file) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	return (ARCHIVE_OK);
}